

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  dynbuf *s;
  undefined1 *puVar1;
  int *piVar2;
  curl_off_t *pcVar3;
  ushort uVar4;
  curlntlm cVar5;
  size_t __n;
  bool bVar6;
  _Bool _Var7;
  CURLcode CVar8;
  statusline sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  void *pvVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  uint uVar17;
  curl_off_t cVar18;
  char digit4;
  char separator;
  char twoorthree [2];
  int httpversion;
  int httpversion_major;
  CURLcode local_88;
  char local_82;
  char local_81;
  connectdata *local_80;
  char local_72 [2];
  uint local_70;
  int local_6c;
  int *local_68;
  _Bool *local_60;
  uint local_54;
  SingleRequest *local_50;
  char *local_48;
  char *local_40;
  ssize_t local_38;
  
  local_50 = &data->req;
  local_38 = *nread;
  local_40 = (data->req).str;
  s = &(data->state).headerb;
  local_68 = &(data->req).httpcode;
  local_80 = conn;
  local_60 = stop_reading;
  do {
    pcVar16 = (data->req).str;
    __n = *nread;
    pvVar13 = memchr(pcVar16,10,__n);
    if (pvVar13 == (void *)0x0) {
      CVar8 = Curl_dyn_addn(s,pcVar16,__n);
      if (CVar8 != CURLE_OK) goto LAB_00611d16;
      iVar11 = 2;
      if ((data->req).headerline == 0) {
        pcVar16 = Curl_dyn_ptr(s);
        sVar15 = Curl_dyn_len(s);
        sVar9 = checkhttpprefix(data,pcVar16,sVar15);
        if (sVar9 == STATUS_BAD) {
          puVar1 = &(data->req).field_0xd9;
          *puVar1 = *puVar1 & 0xfe;
          (data->req).badheader = HEADER_ALLBAD;
          iVar11 = 2;
          Curl_conncontrol(conn,2);
          if ((*(ulong *)&(data->set).field_0x8e2 & 0x20000000000000) == 0) {
            Curl_failf(data,"Received HTTP/0.9 when not allowed");
            iVar11 = 1;
            local_88 = CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
      }
      goto LAB_00611d1a;
    }
    *nread = (ssize_t)(pcVar16 + ~(ulong)pvVar13 + __n);
    (data->req).str = (char *)((long)pvVar13 + 1);
    CVar8 = Curl_dyn_addn(s,pcVar16,((long)pvVar13 + 1) - (long)pcVar16);
    if (CVar8 == CURLE_OK) {
      if ((data->req).headerline == 0) {
        pcVar14 = Curl_dyn_ptr(s);
        sVar15 = Curl_dyn_len(s);
        sVar9 = checkhttpprefix(data,pcVar14,sVar15);
        iVar11 = 0;
        if (sVar9 == STATUS_BAD) {
          Curl_conncontrol(local_80,2);
          if ((*(ulong *)&(data->set).field_0x8e2 & 0x20000000000000) == 0) {
            Curl_failf(data,"Received HTTP/0.9 when not allowed");
            iVar11 = 1;
            local_88 = CURLE_UNSUPPORTED_PROTOCOL;
          }
          else {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 & 0xfe;
            if (*nread == 0) {
              (data->req).badheader = HEADER_ALLBAD;
              *nread = local_38;
              (data->req).str = local_40;
              local_88 = CURLE_OK;
              iVar11 = 1;
            }
            else {
              (data->req).badheader = HEADER_PARTHEADER;
              iVar11 = 2;
            }
          }
        }
        conn = local_80;
        if (sVar9 == STATUS_BAD) goto LAB_00611d1a;
      }
      pcVar14 = Curl_dyn_ptr(s);
      if ((*pcVar14 == '\r') || (*pcVar14 == '\n')) {
        uVar17 = (data->req).httpcode;
        if (uVar17 - 100 < 100) {
          if ((char)uVar17 == 'e') {
            if ((data->req).upgr101 == UPGR101_H2) {
              Curl_infof(data,"Received 101, Switching to HTTP/2");
              (data->req).upgr101 = UPGR101_RECEIVED;
              puVar1 = &(data->req).field_0xd9;
              *puVar1 = *puVar1 | 1;
              (data->req).headerline = 0;
              CVar8 = Curl_http2_switched(data,(data->req).str,*nread);
              if (CVar8 != CURLE_OK) goto LAB_00611d16;
              *nread = 0;
            }
            else {
              puVar1 = &(data->req).field_0xd9;
              *puVar1 = *puVar1 & 0xfe;
            }
          }
          else if ((uVar17 & 0xff) == 100) {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
            if ((data->req).exp100 != EXP100_SEND_DATA) {
              (data->req).exp100 = EXP100_SEND_DATA;
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 2;
              Curl_expire_done(data,EXPIRE_100_TIMEOUT);
            }
          }
          else {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
          }
        }
        else {
          uVar4 = *(ushort *)&(data->req).field_0xd9;
          *(ushort *)&(data->req).field_0xd9 = uVar4 & 0xfffe;
          if (((((uVar4 & 0x20) == 0 && (data->req).size == -1) &&
               (((conn->bits).field_0x4 & 0x40) == 0)) && (conn->httpversion == '\v')) &&
             (((conn->handler->protocol & 0x40000) == 0 && ((data->state).httpreq != '\x05')))) {
            Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
            Curl_conncontrol(conn,2);
          }
        }
        if ((((data->req).field_0xd9 & 1) != 0) || (CVar8 = Curl_http_size(data), CVar8 == CURLE_OK)
           ) {
          if (((conn->bits).field_0x4 & 0x40) != 0) {
            iVar11 = (data->req).httpcode;
            if (iVar11 == 0x197) {
              cVar5 = conn->proxy_ntlm_state;
            }
            else {
              if (iVar11 != 0x191) goto LAB_00612137;
              cVar5 = conn->http_ntlm_state;
            }
            if (cVar5 == NTLMSTATE_TYPE2) {
              Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
              puVar1 = &(data->state).field_0x6d0;
              *puVar1 = *puVar1 | 0x20;
            }
          }
LAB_00612137:
          uVar17 = *(uint *)&(data->set).field_0x8e2;
          iVar11 = (data->req).httpcode;
          sVar15 = Curl_dyn_len(s);
          pcVar14 = Curl_dyn_ptr(s);
          CVar8 = Curl_client_write(data,(uVar17 >> 0x16 & 1) + (uint)(iVar11 - 100U < 100) * 0x10 +
                                         2,pcVar14,sVar15);
          if (CVar8 == CURLE_OK) {
            pcVar3 = &(data->info).header_size;
            *pcVar3 = *pcVar3 + sVar15;
            cVar18 = (data->req).headerbytecount + sVar15;
            (data->req).headerbytecount = cVar18;
            _Var7 = http_should_fail(data);
            if (_Var7) {
              Curl_failf(data,"The requested URL returned error: %d");
              local_88 = CURLE_HTTP_RETURNED_ERROR;
              iVar11 = 1;
              conn = local_80;
              goto LAB_00611d1a;
            }
            if (99 < (data->req).httpcode - 100U) {
              cVar18 = 0;
            }
            (data->req).deductheadercount = cVar18;
            CVar8 = Curl_http_auth_act(data);
            if (CVar8 == CURLE_OK) {
              if (299 < (data->req).httpcode) {
                if ((((*(uint *)&(local_80->bits).field_0x4 & 0x30040) == 0) &&
                    ((byte)((data->state).httpreq - 1) < 4)) &&
                   (Curl_expire_done(data,EXPIRE_100_TIMEOUT), ((data->req).field_0xd9 & 4) == 0)) {
                  if (((data->req).httpcode == 0x1a1) && (((data->state).field_0x6d0 & 0x80) != 0))
                  {
                    Curl_infof(data,"Got 417 while waiting for a 100");
                    puVar1 = &(data->state).field_0x6d1;
                    *puVar1 = *puVar1 | 1;
                    pcVar14 = (*Curl_cstrdup)((data->state).url);
                    (data->req).newurl = pcVar14;
                    Curl_done_sending(data,local_50);
                  }
                  else if (((data->set).field_0x8e4 & 4) == 0) {
                    Curl_infof(data,"HTTP error before end of send, stop sending");
                    Curl_conncontrol(local_80,2);
                    CVar8 = Curl_done_sending(data,local_50);
                    if (CVar8 != CURLE_OK) goto LAB_0061218b;
                    puVar1 = &(data->req).field_0xd9;
                    *puVar1 = *puVar1 | 4;
                    if (((data->state).field_0x6d0 & 0x80) != 0) {
                      (data->req).exp100 = EXP100_FAILED;
                    }
                  }
                  else {
                    Curl_infof(data,"HTTP error before end of send, keep sending");
                    if ((data->req).exp100 != EXP100_SEND_DATA) {
                      (data->req).exp100 = EXP100_SEND_DATA;
                      piVar2 = &(data->req).keepon;
                      *(byte *)piVar2 = (byte)*piVar2 | 2;
                    }
                  }
                }
                if (((local_80->bits).field_0x6 & 2) != 0) {
                  Curl_infof(data,"Keep sending data to get tossed away");
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 | 2;
                }
              }
              if (((data->req).field_0xd9 & 1) == 0) {
                if (((data->set).field_0x8e5 & 2) != 0) {
                  *local_60 = true;
                }
                if (((data->req).maxdownload == 0) &&
                   (((local_80->handler->protocol & 3) == 0 || (local_80->httpversion != '\x14'))))
                {
                  *local_60 = true;
                }
                if (*local_60 == true) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                }
                Curl_debug(data,CURLINFO_HEADER_IN,pcVar16,sVar15);
                iVar11 = 2;
                conn = local_80;
              }
              else {
                Curl_dyn_reset(s);
                iVar11 = 3;
                conn = local_80;
              }
              goto LAB_00611d1a;
            }
          }
LAB_0061218b:
          iVar11 = 1;
          conn = local_80;
          local_88 = CVar8;
          goto LAB_00611d1a;
        }
        goto LAB_00611d16;
      }
      iVar11 = (data->req).headerline;
      (data->req).headerline = iVar11 + 1;
      uVar17 = 2;
      local_48 = pcVar14;
      if (iVar11 == 0) {
        uVar17 = conn->handler->protocol;
        if ((uVar17 & 3) == 0) {
          if ((uVar17 >> 0x12 & 1) == 0) {
LAB_006122fc:
            iVar10 = 0;
          }
          else {
            iVar10 = 0;
            iVar11 = __isoc99_sscanf(pcVar14," RTSP/%1d.%1d%c%3d",&local_6c,&local_70,local_72,
                                     local_68);
            if (iVar11 != 4) goto LAB_006122fc;
            if (local_72[0] == ' ') {
              conn->httpversion = '\v';
              iVar10 = 4;
            }
          }
LAB_006124ca:
          if (iVar10 == 0) {
            puVar1 = &(data->req).field_0xd9;
            *puVar1 = *puVar1 & 0xfe;
            iVar11 = 2;
            bVar6 = false;
            uVar17 = 2;
          }
          else {
            Curl_http_statusline(data,conn);
            uVar17 = 6;
            iVar11 = 0;
            bVar6 = true;
          }
        }
        else {
          local_70 = 0;
          local_82 = '\0';
          iVar10 = __isoc99_sscanf(pcVar14," HTTP/%1d.%1d%c%3d%c",&local_6c,&local_70,&local_81,
                                   local_68,&local_82);
          if (((iVar10 == 1) && (1 < local_6c)) &&
             (iVar11 = __isoc99_sscanf(pcVar14," HTTP/%1[23] %d",local_72,local_68), iVar11 == 2)) {
            conn->httpversion = '\0';
            local_81 = ' ';
            iVar10 = 4;
LAB_00612318:
            if ((iVar10 < 4) || (local_81 != ' ')) {
              if (iVar10 != 0) {
                pcVar16 = "Unsupported HTTP version in response";
                goto LAB_00612412;
              }
              iVar10 = __isoc99_sscanf(pcVar14," HTTP %3d",local_68);
              conn->httpversion = '\n';
              if (iVar10 == 0) {
                pcVar16 = Curl_dyn_ptr(s);
                sVar15 = Curl_dyn_len(s);
                sVar9 = checkhttpprefix(data,pcVar16,sVar15);
                iVar10 = 0;
                if (sVar9 == STATUS_DONE) {
                  *local_68 = 200;
                  conn->httpversion = '\n';
                  iVar10 = 1;
                }
              }
            }
            else {
              local_70 = local_6c * 10 + local_70;
              if ((0x14 < local_70) || ((0x100c00U >> (local_70 & 0x1f) & 1) == 0)) {
                Curl_failf(data,"Unsupported HTTP version (%u.%d) in response",
                           (ulong)(uint)((int)local_70 / 10),(ulong)(uint)((int)local_70 % 10));
                goto LAB_00612419;
              }
              conn->httpversion = (uchar)local_70;
              if (((uchar)local_70 != '\x14') && ((data->req).upgr101 == UPGR101_RECEIVED)) {
                Curl_infof(data,"Lying server, not serving HTTP/2");
              }
              if (conn->httpversion < 0x14) {
                conn->bundle->multiuse = -1;
                Curl_infof(data,"Mark bundle as not supporting multiuse");
              }
            }
            bVar6 = true;
          }
          else {
            if ((9 < (byte)(local_82 - 0x30U)) && ((iVar10 < 4 || (99 < *local_68))))
            goto LAB_00612318;
            pcVar16 = "Unsupported response code in HTTP response";
LAB_00612412:
            Curl_failf(data,pcVar16);
LAB_00612419:
            bVar6 = false;
            local_88 = CURLE_UNSUPPORTED_PROTOCOL;
          }
          if (bVar6) goto LAB_006124ca;
          uVar17 = 2;
          iVar11 = 1;
          bVar6 = false;
        }
        if (!bVar6) goto LAB_00611d1a;
      }
      local_54 = uVar17;
      pcVar16 = Curl_dyn_ptr(s);
      sVar15 = Curl_dyn_len(s);
      pvVar13 = memchr(pcVar16,0,sVar15);
      pcVar14 = "Nul byte in header";
      if (pvVar13 == (void *)0x0) {
        iVar11 = (data->req).headerline;
        bVar6 = true;
        CVar8 = CURLE_OK;
        if ((1 < iVar11) &&
           (((*pcVar16 != ' ' && (*pcVar16 != '\t')) || (CVar8 = CURLE_OK, iVar11 == 2)))) {
          pvVar13 = memchr(pcVar16,0x3a,sVar15);
          CVar8 = CURLE_OK;
          pcVar14 = "Header without colon";
          if (pvVar13 == (void *)0x0) goto LAB_0061254d;
        }
      }
      else {
LAB_0061254d:
        bVar6 = false;
        Curl_failf(data,pcVar14);
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      pcVar16 = local_48;
      conn = local_80;
      if (bVar6) {
        CVar8 = Curl_http_header(data,local_80,local_48);
        if (CVar8 == CURLE_OK) {
          uVar12 = *(uint *)&(data->set).field_0x8e2 >> 0x16 & 1 | local_54;
          uVar17 = uVar12 + 0x10;
          if (99 < (data->req).httpcode - 100U) {
            uVar17 = uVar12;
          }
          sVar15 = Curl_dyn_len(s);
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar16,sVar15);
          sVar15 = Curl_dyn_len(s);
          CVar8 = Curl_client_write(data,uVar17,local_48,sVar15);
          if (CVar8 == CURLE_OK) {
            sVar15 = Curl_dyn_len(s);
            pcVar3 = &(data->info).header_size;
            *pcVar3 = *pcVar3 + sVar15;
            sVar15 = Curl_dyn_len(s);
            pcVar3 = &(data->req).headerbytecount;
            *pcVar3 = *pcVar3 + sVar15;
            Curl_dyn_reset(s);
            iVar11 = 0;
            goto LAB_00611d1a;
          }
        }
        goto LAB_00611d16;
      }
      iVar11 = 1;
      local_88 = CVar8;
    }
    else {
LAB_00611d16:
      iVar11 = 1;
      local_88 = CVar8;
    }
LAB_00611d1a:
    if ((iVar11 != 0) && (iVar11 != 3)) {
      if (iVar11 == 2) {
        return CURLE_OK;
      }
      return local_88;
    }
    if (*(data->req).str == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     ssize_t *nread,
                                     bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;
  char *headp;
  char *str_start;
  char *end_ptr;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    end_ptr = memchr(str_start, 0x0a, *nread);

    if(!end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = Curl_dyn_addn(&data->state.headerb, str_start, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st =
          checkprotoprefix(data, conn,
                           Curl_dyn_ptr(&data->state.headerb),
                           Curl_dyn_len(&data->state.headerb));

        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = end_ptr + 1; /* move past new line */

    full_length = k->str - str_start;

    result = Curl_dyn_addn(&data->state.headerb, str_start, full_length);
    if(result)
      return result;

    /****
     * We now have a FULL header line in 'headerb'.
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       Curl_dyn_len(&data->state.headerb));
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so use 0x0a and 0x0d instead of '\n'
       and '\r' */
    headp = Curl_dyn_ptr(&data->state.headerb);
    if((0x0a == *headp) || (0x0d == *headp)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

      if('\r' == *headp)
        headp++; /* pass the \r byte */
      if('\n' == *headp)
        headp++; /* pass the \n byte */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_H2) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101, Switching to HTTP/2");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(data, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
#ifdef USE_WEBSOCKETS
          else if(k->upgr101 == UPGR101_WS) {
            /* verify the response */
            result = Curl_ws_accept(data);
            if(result)
              return result;
            k->header = FALSE; /* no more header to parse! */
            if(data->set.connect_only) {
              k->keepon &= ~KEEP_RECV; /* read no more content */
              *nread = 0;
            }
          }
#endif
          else {
            /* Not switching to another protocol */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->state.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      if(!k->header) {
        result = Curl_http_size(data);
        if(result)
          return result;
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER |
        (data->set.include_header ? CLIENTWRITE_BODY : 0) |
        ((k->httpcode/100 == 1) ? CLIENTWRITE_1XX : 0);

      headerlen = Curl_dyn_len(&data->state.headerb);
      result = Curl_client_write(data, writetype,
                                 Curl_dyn_ptr(&data->state.headerb),
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(data)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

#ifdef USE_WEBSOCKETS
      /* All non-101 HTTP status codes are bad when wanting to upgrade to
         websockets */
      if(data->req.upgr101 == UPGR101_WS) {
        failf(data, "Refused WebSockets upgrade: %d", k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }
#endif


      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(data);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->state.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if((k->httpcode == 417) && data->state.expect100header) {
                /* 417 Expectation Failed - try again without the Expect
                   header */
                infof(data, "Got 417 while waiting for a 100");
                data->state.disableexpect = TRUE;
                DEBUGASSERT(!data->req.newurl);
                data->req.newurl = strdup(data->state.url);
                Curl_done_sending(data, k);
              }
              else if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending");
                streamclose(conn, "Stop sending data before everything sent");
                result = Curl_done_sending(data, k);
                if(result)
                  return result;
                k->upload_done = TRUE;
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        Curl_debug(data, CURLINFO_HEADER_IN, str_start, headerlen);
        break; /* exit header line loop */
      }

      /* We continue reading headers, reset the line-based header */
      Curl_dyn_reset(&data->state.headerb);
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    writetype = CLIENTWRITE_HEADER;
    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#define HEADER1 headp /* no conversion needed, just use headp */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We allow any three-digit number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        char twoorthree[2];
        int httpversion = 0;
        char digit4 = 0;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d%c",
                    &httpversion_major,
                    &httpversion,
                    &separator,
                    &k->httpcode,
                    &digit4);

        if(nc == 1 && httpversion_major >= 2 &&
           2 == sscanf(HEADER1, " HTTP/%1[23] %d", twoorthree, &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        /* There can only be a 4th response code digit stored in 'digit4' if
           all the other fields were parsed and stored first, so nc is 5 when
           digit4 a digit.

           The sscanf() line above will also allow zero-prefixed and negative
           numbers, so we check for that too here.
        */
        else if(ISDIGIT(digit4) || (nc >= 4 && k->httpcode < 100)) {
          failf(data, "Unsupported response code in HTTP response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }

        if((nc >= 4) && (' ' == separator)) {
          httpversion += 10 * httpversion_major;
          switch(httpversion) {
          case 10:
          case 11:
#ifdef USE_HTTP2
          case 20:
#endif
#ifdef ENABLE_QUIC
          case 30:
#endif
            conn->httpversion = (unsigned char)httpversion;
            break;
          default:
            failf(data, "Unsupported HTTP version (%u.%d) in response",
                  httpversion/10, httpversion%10);
            return CURLE_UNSUPPORTED_PROTOCOL;
          }

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            statusline check =
              checkhttpprefix(data,
                              Curl_dyn_ptr(&data->state.headerb),
                              Curl_dyn_len(&data->state.headerb));
            if(check == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        int rtspversion;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        result = Curl_http_statusline(data, conn);
        if(result)
          return result;
        writetype |= CLIENTWRITE_STATUS;
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = verify_header(data);
    if(result)
      return result;

    result = Curl_http_header(data, conn, headp);
    if(result)
      return result;

    /*
     * End of header-checks. Write them to the client.
     */
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;
    if(k->httpcode/100 == 1)
      writetype |= CLIENTWRITE_1XX;

    Curl_debug(data, CURLINFO_HEADER_IN, headp,
               Curl_dyn_len(&data->state.headerb));

    result = Curl_client_write(data, writetype, headp,
                               Curl_dyn_len(&data->state.headerb));
    if(result)
      return result;

    data->info.header_size += Curl_dyn_len(&data->state.headerb);
    data->req.headerbytecount += Curl_dyn_len(&data->state.headerb);

    Curl_dyn_reset(&data->state.headerb);
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}